

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  uint32_t uVar2;
  ulong local_4a0;
  size_t n_1;
  ulong uStack_490;
  uint32_t max;
  size_t n;
  uint32_t letter_counts [26];
  char local_418 [8];
  char word [1024];
  char **argv_local;
  int argc_local;
  
  for (uStack_490 = 0; word._1016_8_ = argv, uStack_490 < 0x1a; uStack_490 = uStack_490 + 1) {
    letter_counts[uStack_490 - 2] = 0;
  }
  while (_Var1 = ask_word(local_418,6,0x400), _Var1) {
    count_letters((uint32_t *)&n,local_418);
  }
  uVar2 = max_count((uint32_t *)&n);
  printf("The most used letters are ");
  for (local_4a0 = 0; local_4a0 < 0x1a; local_4a0 = local_4a0 + 1) {
    if (letter_counts[local_4a0 - 2] == uVar2) {
      printf("%c ",(ulong)((int)(char)local_4a0 + 0x41));
    }
  }
  printf("\nEach are used %u times.\n",(ulong)uVar2);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  char word[1024];
  uint32_t letter_counts[26];

  for (size_t n = 0; n < 26; n++) letter_counts[n] = 0;

  while (ask_word(word, 6, sizeof word)) {
    count_letters(letter_counts, word);
  }

  uint32_t max = max_count(letter_counts);

  printf("The most used letters are ");
  for (size_t n = 0; n < 26; n++) {
    if (letter_counts[n] == max) printf("%c ", 'A' + (char)n);
  }
  printf("\nEach are used %" PRIu32 " times.\n", max);

  return 0;
}